

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void anon_unknown.dwarf_417dc2::createImplicitNets
               (HierarchicalInstanceSyntax *instance,ASTContext *context,NetType *netType,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>
               *implicitNetNames,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  char *pcVar1;
  SyntaxKind SVar2;
  Scope *pSVar3;
  Compilation *this;
  ulong uVar4;
  PortConnectionSyntax *this_00;
  OrderedPortConnectionSyntax *pOVar5;
  NamedPortConnectionSyntax *pNVar6;
  NetSymbol *pNVar7;
  pointer pTVar8;
  SyntaxNode *expr;
  long lVar9;
  size_t index;
  long lVar10;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>,_8UL>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar11;
  Token t;
  SmallVector<slang::parsing::Token,_8UL> implicitNets;
  string_view local_118;
  size_t local_108;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_100;
  NetType *local_f8;
  pointer local_f0;
  long local_e8;
  SourceLocation local_e0;
  Token local_d8;
  SmallVectorBase<slang::parsing::Token> local_c8 [3];
  
  if ((netType->netKind != Unknown) &&
     (uVar4 = (instance->connections).elements.size_ + 1, 1 < uVar4)) {
    index = 0;
    local_100 = results;
    local_f8 = netType;
    do {
      this_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::operator[]
                          (&instance->connections,index);
      SVar2 = (this_00->super_SyntaxNode).kind;
      if (SVar2 == NamedPortConnection) {
        pNVar6 = slang::syntax::SyntaxNode::as<slang::syntax::NamedPortConnectionSyntax>
                           (&this_00->super_SyntaxNode);
        expr = &pNVar6->expr->super_SyntaxNode;
      }
      else if (SVar2 == OrderedPortConnection) {
        pOVar5 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedPortConnectionSyntax>
                           (&this_00->super_SyntaxNode);
        expr = &((pOVar5->expr).ptr)->super_SyntaxNode;
        if (expr == (SyntaxNode *)0x0) {
          slang::assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
                    );
        }
      }
      else {
        expr = (SyntaxNode *)0x0;
      }
      if (expr != (SyntaxNode *)0x0) {
        local_c8[0].len = 0;
        local_c8[0].cap = 8;
        local_108 = index;
        local_c8[0].data_ = (pointer)local_c8[0].firstElement;
        slang::ast::Expression::findPotentiallyImplicitNets(expr,context,local_c8);
        if (local_c8[0].len != 0) {
          lVar9 = local_c8[0].len << 4;
          lVar10 = 0;
          local_f0 = local_c8[0].data_;
          pTVar8 = local_c8[0].data_;
          local_e8 = lVar9;
          do {
            pcVar1 = (char *)((long)&pTVar8->kind + lVar10);
            local_d8._0_8_ = *(undefined8 *)pcVar1;
            local_d8.info = *(Info **)(pcVar1 + 8);
            local_118 = slang::parsing::Token::valueText(&local_d8);
            pVar11 = ska::detailv3::
                     sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>>
                     ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                               ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>,8ul>>
                                 *)&implicitNetNames->
                                    super_flat_hash_set<std::basic_string_view<char>,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char>_>,_8UL>_>
                                ,&local_118);
            if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pSVar3 = (context->scope).ptr;
              if (pSVar3 == (Scope *)0x0) {
                slang::assert::assertFailed
                          ("ptr",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                           ,0x26,
                           "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                          );
              }
              this = pSVar3->compilation;
              local_118 = slang::parsing::Token::valueText(&local_d8);
              local_e0 = slang::parsing::Token::location(&local_d8);
              pNVar7 = slang::BumpAllocator::
                       emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                                 (&this->super_BumpAllocator,&local_118,&local_e0,local_f8);
              (pNVar7->super_ValueSymbol).declaredType.type = this->logicType;
              local_118._M_len = (size_t)pNVar7;
              slang::SmallVectorBase<slang::ast::Symbol_const*>::
              emplace_back<slang::ast::Symbol_const*>
                        ((SmallVectorBase<slang::ast::Symbol_const*> *)local_100,
                         (Symbol **)&local_118);
              pTVar8 = local_f0;
              lVar9 = local_e8;
            }
            lVar10 = lVar10 + 0x10;
          } while (lVar9 != lVar10);
        }
        index = local_108;
        if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
          free(local_c8[0].data_);
        }
      }
      index = index + 1;
    } while (index != uVar4 >> 1);
  }
  return;
}

Assistant:

void createImplicitNets(const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                        const NetType& netType, SmallSet<string_view, 8>& implicitNetNames,
                        SmallVectorBase<const Symbol*>& results) {
    // If no default nettype is set, we don't create implicit nets.
    if (netType.isError())
        return;

    for (auto conn : instance.connections) {
        const PropertyExprSyntax* expr = nullptr;
        switch (conn->kind) {
            case SyntaxKind::OrderedPortConnection:
                expr = conn->as<OrderedPortConnectionSyntax>().expr;
                break;
            case SyntaxKind::NamedPortConnection:
                expr = conn->as<NamedPortConnectionSyntax>().expr;
                break;
            default:
                break;
        }

        if (!expr)
            continue;

        SmallVector<Token, 8> implicitNets;
        Expression::findPotentiallyImplicitNets(*expr, context, implicitNets);

        for (Token t : implicitNets) {
            if (implicitNetNames.emplace(t.valueText()).second) {
                auto& comp = context.getCompilation();
                auto net = comp.emplace<NetSymbol>(t.valueText(), t.location(), netType);
                net->setType(comp.getLogicType());
                results.push_back(net);
            }
        }
    }
}